

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,_ *param_2,Maybe<kj::Url> *param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  _ *params;
  ArrayPtr<const_char> local_48;
  String local_38;
  _ *local_20;
  DebugComparison<kj::Maybe<kj::Url>,_const_kj::None_&> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::Maybe<kj::Url>,kj::String>(&local_38,param_2,param_3);
  params = local_20 + 0xf0;
  local_48 = (ArrayPtr<const_char>)tryToCharSequence(*(undefined8 *)(local_20 + 0xe8));
  concat<kj::String,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_38,(String *)params,(StringPtr *)&local_48,param_5);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}